

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

void __thiscall bloaty::dwarf::DIEReader::SkipChildren(DIEReader *this,CU *cu,Abbrev *abbrev)

{
  int iVar1;
  pointer pAVar2;
  Abbrev *pAVar3;
  string_view *in_R8;
  pointer pAVar4;
  AttrValue AStack_48;
  
  if (abbrev->has_child == true) {
    iVar1 = this->depth_;
    SkipNullEntries(this);
    while ((iVar1 <= this->depth_ && (pAVar3 = ReadCode(this,cu), pAVar3 != (Abbrev *)0x0))) {
      pAVar2 = (pAVar3->attr).
               super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pAVar4 = (pAVar3->attr).
                    super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                    ._M_impl.super__Vector_impl_data._M_start; pAVar4 != pAVar2; pAVar4 = pAVar4 + 1
          ) {
        AttrValue::ParseAttr
                  (&AStack_48,(AttrValue *)cu,(CU *)(ulong)pAVar4->form,(uint16_t)this,in_R8);
      }
      SkipNullEntries(this);
    }
  }
  return;
}

Assistant:

void DIEReader::SkipChildren(const CU& cu, const AbbrevTable::Abbrev* abbrev) {
  if (!abbrev->has_child) {
    return;
  }

  int target_depth = depth_ - 1;
  SkipNullEntries();
  while (depth_ > target_depth) {
    // TODO(haberman): use DW_AT_sibling to optimize skipping when it is
    // available.
    abbrev = ReadCode(cu);
    if (!abbrev) {
      return;
    }
    ReadAttributes(cu, abbrev, [](uint16_t, dwarf::AttrValue) {});
    SkipNullEntries();
  }
}